

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

void __thiscall
glcts::ShaderBitfieldOperationCaseUnaryInt::ShaderBitfieldOperationCaseUnaryInt
          (ShaderBitfieldOperationCaseUnaryInt *this,Context *context,char *name,
          GLSLVersion glslVersion,char *funcName,UnaryIFunc func,Data *data,int components,
          char *testStatement)

{
  string *psVar1;
  ulong uVar2;
  
  ShaderBitfieldOperationCase::ShaderBitfieldOperationCase
            (&this->super_ShaderBitfieldOperationCase,context,name,fixed_sample_locations_values + 1
             ,glslVersion,data,testStatement);
  (this->super_ShaderBitfieldOperationCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderBitfieldOperationCase_01dee128;
  this->m_components = components;
  this->m_func = func;
  psVar1 = &(this->super_ShaderBitfieldOperationCase).m_testStatement;
  uVar2 = std::__cxx11::string::find((char *)psVar1,0x1835bb6);
  std::__cxx11::string::replace((ulong)psVar1,uVar2,&DAT_00000004);
  return;
}

Assistant:

ShaderBitfieldOperationCaseUnaryInt(Context& context, const char* name, glu::GLSLVersion glslVersion,
										char const* funcName, UnaryIFunc func, Data const& data, int components,
										char const* testStatement)
		: ShaderBitfieldOperationCase(context, name, "", glslVersion, data, testStatement)
		, m_components(components)
		, m_func(func)
	{
		size_t pos = m_testStatement.find("func");
		m_testStatement.replace(pos, 4, funcName);
	}